

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O3

monster * group_monster_tracking(chunk_conflict *c,monster *mon)

{
  mon_group_list_entry *pmVar1;
  _Bool _Var2;
  monster *pmVar3;
  
  pmVar1 = c->monster_groups[mon->group_info[0].index]->member_list;
  do {
    if (pmVar1 == (mon_group_list_entry *)0x0) {
      return (monster *)0x0;
    }
    pmVar3 = cave_monster(c,pmVar1->midx);
    if (pmVar3 != mon) {
      _Var2 = flag_has_dbg(pmVar3->mflag,2,10,"tracker->mflag","MFLAG_TRACKING");
      if ((_Var2) &&
         (_Var2 = flag_has_dbg(pmVar3->mflag,2,2,"tracker->mflag","MFLAG_ACTIVE"), _Var2)) {
        return pmVar3;
      }
    }
    pmVar1 = pmVar1->next;
  } while( true );
}

Assistant:

struct monster *group_monster_tracking(struct chunk *c,
									   const struct monster *mon)
{
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	while (entry) {
		struct monster *tracker = cave_monster(c, entry->midx);
		if (tracker != mon &&
				mflag_has(tracker->mflag, MFLAG_TRACKING) &&
				mflag_has(tracker->mflag, MFLAG_ACTIVE)) {
			return tracker;
		}
		entry = entry->next;
	}

	return NULL;
}